

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::reportVector
          (HSimplexNla *this,string *message,HighsInt num_index,
          vector<double,_std::allocator<double>_> *vector_value,
          vector<int,_std::allocator<int>_> *vector_index,bool force)

{
  uint uVar1;
  undefined8 uVar2;
  uint *puVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  int in_EDX;
  string *in_RSI;
  long *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  byte in_R9B;
  HighsInt iX;
  HighsInt num_row;
  string *in_stack_00000348;
  undefined1 in_stack_00000357;
  vector<double,_std::allocator<double>_> *in_stack_00000358;
  HighsInt in_stack_00000364;
  string *in_stack_00000368;
  HighsLogOptions *in_stack_00000370;
  int local_88;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  undefined4 local_30;
  byte local_29;
  int local_14;
  
  local_29 = in_R9B & 1;
  if ((((*(byte *)(in_RDI + 0xf5) & 1) != 0) || (local_29 != 0)) && (0 < in_EDX)) {
    local_30 = *(undefined4 *)(*in_RDI + 4);
    if (in_EDX < 0x1a) {
      local_14 = in_EDX;
      uVar2 = std::__cxx11::string::c_str();
      printf("%s",uVar2);
      for (local_88 = 0; local_88 < local_14; local_88 = local_88 + 1) {
        if (local_88 % 5 == 0) {
          printf("\n");
        }
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_88);
        uVar1 = *puVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_88);
        printf("[%4d %11.4g] ",*pvVar4,(ulong)uVar1);
      }
      printf("\n");
    }
    else {
      std::__cxx11::string::string(local_50,in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Unknown",&local_71);
      analyseVectorValues(in_stack_00000370,in_stack_00000368,in_stack_00000364,in_stack_00000358,
                          (bool)in_stack_00000357,in_stack_00000348);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::__cxx11::string::~string(local_50);
    }
  }
  return;
}

Assistant:

void HSimplexNla::reportVector(const std::string message,
                               const HighsInt num_index,
                               const vector<double> vector_value,
                               const vector<HighsInt> vector_index,
                               const bool force) const {
  if (!report_ && !force) return;
  assert((int)vector_value.size() >= num_index);
  if (num_index <= 0) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_index > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector_value, true);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iX = 0; iX < num_index; iX++) {
      if (iX % 5 == 0) printf("\n");
      printf("[%4d %11.4g] ", (int)vector_index[iX], vector_value[iX]);
    }
    printf("\n");
  }
}